

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

bool CoreML::Specification::GLMClassifier_ClassEncoding_Parse
               (ConstStringParam name,GLMClassifier_ClassEncoding *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  GLMClassifier_ClassEncoding local_1c;
  bool success;
  GLMClassifier_ClassEncoding *pGStack_18;
  int int_value;
  GLMClassifier_ClassEncoding *value_local;
  ConstStringParam name_local;
  
  pGStack_18 = value;
  value_local = (GLMClassifier_ClassEncoding *)name;
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,name);
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)GLMClassifier_ClassEncoding_entries,(EnumEntry *)0x2,
                     (size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pGStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool GLMClassifier_ClassEncoding_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, GLMClassifier_ClassEncoding* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      GLMClassifier_ClassEncoding_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<GLMClassifier_ClassEncoding>(int_value);
  }
  return success;
}